

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::RawMatrix::mult(RawMatrix *dst,RawMatrix *src1,RawMatrix *src2)

{
  RawMatrix *src2_local;
  RawMatrix *src1_local;
  RawMatrix *dst_local;
  
  (dst->right).x =
       (float32)((float)src1->rightw * (float)(src2->pos).x +
                (float)(src1->right).z * (float)(src2->at).x +
                (float)(src1->right).x * (float)(src2->right).x +
                (float)(src1->right).y * (float)(src2->up).x);
  (dst->right).y =
       (float32)((float)src1->rightw * (float)(src2->pos).y +
                (float)(src1->right).z * (float)(src2->at).y +
                (float)(src1->right).x * (float)(src2->right).y +
                (float)(src1->right).y * (float)(src2->up).y);
  (dst->right).z =
       (float32)((float)src1->rightw * (float)(src2->pos).z +
                (float)(src1->right).z * (float)(src2->at).z +
                (float)(src1->right).x * (float)(src2->right).z +
                (float)(src1->right).y * (float)(src2->up).z);
  dst->rightw = (float32)((float)src1->rightw * (float)src2->posw +
                         (float)(src1->right).z * (float)src2->atw +
                         (float)(src1->right).x * (float)src2->rightw +
                         (float)(src1->right).y * (float)src2->upw);
  (dst->up).x = (float32)((float)src1->upw * (float)(src2->pos).x +
                         (float)(src1->up).z * (float)(src2->at).x +
                         (float)(src1->up).x * (float)(src2->right).x +
                         (float)(src1->up).y * (float)(src2->up).x);
  (dst->up).y = (float32)((float)src1->upw * (float)(src2->pos).y +
                         (float)(src1->up).z * (float)(src2->at).y +
                         (float)(src1->up).x * (float)(src2->right).y +
                         (float)(src1->up).y * (float)(src2->up).y);
  (dst->up).z = (float32)((float)src1->upw * (float)(src2->pos).z +
                         (float)(src1->up).z * (float)(src2->at).z +
                         (float)(src1->up).x * (float)(src2->right).z +
                         (float)(src1->up).y * (float)(src2->up).z);
  dst->upw = (float32)((float)src1->upw * (float)src2->posw +
                      (float)(src1->up).z * (float)src2->atw +
                      (float)(src1->up).x * (float)src2->rightw +
                      (float)(src1->up).y * (float)src2->upw);
  (dst->at).x = (float32)((float)src1->atw * (float)(src2->pos).x +
                         (float)(src1->at).z * (float)(src2->at).x +
                         (float)(src1->at).x * (float)(src2->right).x +
                         (float)(src1->at).y * (float)(src2->up).x);
  (dst->at).y = (float32)((float)src1->atw * (float)(src2->pos).y +
                         (float)(src1->at).z * (float)(src2->at).y +
                         (float)(src1->at).x * (float)(src2->right).y +
                         (float)(src1->at).y * (float)(src2->up).y);
  (dst->at).z = (float32)((float)src1->atw * (float)(src2->pos).z +
                         (float)(src1->at).z * (float)(src2->at).z +
                         (float)(src1->at).x * (float)(src2->right).z +
                         (float)(src1->at).y * (float)(src2->up).z);
  dst->atw = (float32)((float)src1->atw * (float)src2->posw +
                      (float)(src1->at).z * (float)src2->atw +
                      (float)(src1->at).x * (float)src2->rightw +
                      (float)(src1->at).y * (float)src2->upw);
  (dst->pos).x = (float32)((float)src1->posw * (float)(src2->pos).x +
                          (float)(src1->pos).z * (float)(src2->at).x +
                          (float)(src1->pos).x * (float)(src2->right).x +
                          (float)(src1->pos).y * (float)(src2->up).x);
  (dst->pos).y = (float32)((float)src1->posw * (float)(src2->pos).y +
                          (float)(src1->pos).z * (float)(src2->at).y +
                          (float)(src1->pos).x * (float)(src2->right).y +
                          (float)(src1->pos).y * (float)(src2->up).y);
  (dst->pos).z = (float32)((float)src1->posw * (float)(src2->pos).z +
                          (float)(src1->pos).z * (float)(src2->at).z +
                          (float)(src1->pos).x * (float)(src2->right).z +
                          (float)(src1->pos).y * (float)(src2->up).z);
  dst->posw = (float32)((float)src1->posw * (float)src2->posw +
                       (float)(src1->pos).z * (float)src2->atw +
                       (float)(src1->pos).x * (float)src2->rightw +
                       (float)(src1->pos).y * (float)src2->upw);
  return;
}

Assistant:

void
RawMatrix::mult(RawMatrix *dst, RawMatrix *src1, RawMatrix *src2)
{
	dst->right.x = src1->right.x*src2->right.x + src1->right.y*src2->up.x + src1->right.z*src2->at.x + src1->rightw*src2->pos.x;
	dst->right.y = src1->right.x*src2->right.y + src1->right.y*src2->up.y + src1->right.z*src2->at.y + src1->rightw*src2->pos.y;
	dst->right.z = src1->right.x*src2->right.z + src1->right.y*src2->up.z + src1->right.z*src2->at.z + src1->rightw*src2->pos.z;
	dst->rightw  = src1->right.x*src2->rightw  + src1->right.y*src2->upw  + src1->right.z*src2->atw  + src1->rightw*src2->posw;
	dst->up.x    = src1->up.x*src2->right.x    + src1->up.y*src2->up.x    + src1->up.z*src2->at.x + src1->upw*src2->pos.x;
	dst->up.y    = src1->up.x*src2->right.y    + src1->up.y*src2->up.y    + src1->up.z*src2->at.y + src1->upw*src2->pos.y;
	dst->up.z    = src1->up.x*src2->right.z    + src1->up.y*src2->up.z    + src1->up.z*src2->at.z + src1->upw*src2->pos.z;
	dst->upw     = src1->up.x*src2->rightw     + src1->up.y*src2->upw     + src1->up.z*src2->atw  + src1->upw*src2->posw;
	dst->at.x    = src1->at.x*src2->right.x    + src1->at.y*src2->up.x    + src1->at.z*src2->at.x + src1->atw*src2->pos.x;
	dst->at.y    = src1->at.x*src2->right.y    + src1->at.y*src2->up.y    + src1->at.z*src2->at.y + src1->atw*src2->pos.y;
	dst->at.z    = src1->at.x*src2->right.z    + src1->at.y*src2->up.z    + src1->at.z*src2->at.z + src1->atw*src2->pos.z;
	dst->atw     = src1->at.x*src2->rightw     + src1->at.y*src2->upw     + src1->at.z*src2->atw  + src1->atw*src2->posw;
	dst->pos.x   = src1->pos.x*src2->right.x   + src1->pos.y*src2->up.x   + src1->pos.z*src2->at.x + src1->posw*src2->pos.x;
	dst->pos.y   = src1->pos.x*src2->right.y   + src1->pos.y*src2->up.y   + src1->pos.z*src2->at.y + src1->posw*src2->pos.y;
	dst->pos.z   = src1->pos.x*src2->right.z   + src1->pos.y*src2->up.z   + src1->pos.z*src2->at.z + src1->posw*src2->pos.z;
	dst->posw    = src1->pos.x*src2->rightw    + src1->pos.y*src2->upw    + src1->pos.z*src2->atw  + src1->posw*src2->posw;
}